

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

bool __thiscall QWizard::hasVisitedPage(QWizard *this,int theid)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  plVar1 = (long *)(lVar5 + 0x330);
  if (*plVar1 != 0) {
    plVar2 = (long *)(lVar5 + 0x328);
    lVar6 = -4;
    do {
      lVar3 = *plVar1 * -4 + lVar6;
      if (lVar3 == -4) goto LAB_005178d1;
      lVar5 = lVar6 + 4;
      piVar4 = (int *)(*plVar2 + 4 + lVar6);
      lVar6 = lVar5;
    } while (*piVar4 != theid);
    lVar5 = lVar5 >> 2;
LAB_005178d1:
    if (lVar3 != -4) goto LAB_005178de;
  }
  lVar5 = -1;
LAB_005178de:
  return lVar5 != -1;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }